

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfileinfo.cpp
# Opt level: O2

bool __thiscall QFileInfo::makeAbsolute(QFileInfo *this)

{
  QFileInfoPrivate *pQVar1;
  bool bVar2;
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_30;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar1 = (this->d_ptr).d.ptr;
  if ((pQVar1->field_0x1db & 0x40) == 0) {
    bVar2 = QFileSystemEntry::isRelative(&pQVar1->fileEntry);
    if (bVar2) {
      absoluteFilePath((QString *)&local_30,this);
      setFile(this,(QString *)&local_30);
      QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_30);
      bVar2 = true;
      goto LAB_00222964;
    }
  }
  bVar2 = false;
LAB_00222964:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool QFileInfo::makeAbsolute()
{
    if (d_ptr.constData()->isDefaultConstructed
            || !d_ptr.constData()->fileEntry.isRelative())
        return false;

    setFile(absoluteFilePath());
    return true;
}